

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

void normal_updatePosition(ENCODING *enc,char *ptr,char *end,POSITION *pos)

{
  byte *pbVar1;
  
  if (end != ptr && -1 < (long)end - (long)ptr) {
    do {
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
      case 5:
        ptr = (char *)((byte *)ptr + 2);
        break;
      case 6:
        ptr = (char *)((byte *)ptr + 3);
        break;
      case 7:
        ptr = (char *)((byte *)ptr + 4);
        break;
      default:
        ptr = (char *)((byte *)ptr + 1);
        break;
      case 9:
        pos->lineNumber = pos->lineNumber + 1;
        pbVar1 = (byte *)ptr + 1;
        if (((byte *)end != pbVar1 && -1 < (long)end - (long)pbVar1) &&
           (*(char *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]) == '\n')) {
          pbVar1 = (byte *)ptr + 2;
        }
        ptr = (char *)pbVar1;
        pos->columnNumber = 0;
        goto LAB_006d6301;
      case 10:
        pos->columnNumber = 0;
        pos->lineNumber = pos->lineNumber + 1;
        ptr = (char *)((byte *)ptr + 1);
        goto LAB_006d6301;
      }
      pos->columnNumber = pos->columnNumber + 1;
LAB_006d6301:
    } while (end != ptr && -1 < (long)end - (long)ptr);
  }
  return;
}

Assistant:

static void PTRCALL
PREFIX(updatePosition)(const ENCODING *enc, const char *ptr, const char *end,
                       POSITION *pos) {
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    ptr += n; /* NOTE: The encoding has already been validated. */             \
    pos->columnNumber++;                                                       \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_LF:
      pos->columnNumber = 0;
      pos->lineNumber++;
      ptr += MINBPC(enc);
      break;
    case BT_CR:
      pos->lineNumber++;
      ptr += MINBPC(enc);
      if (HAS_CHAR(enc, ptr, end) && BYTE_TYPE(enc, ptr) == BT_LF)
        ptr += MINBPC(enc);
      pos->columnNumber = 0;
      break;
    default:
      ptr += MINBPC(enc);
      pos->columnNumber++;
      break;
    }
  }
}